

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.c
# Opt level: O0

void flatviews_reset(uc_struct_conflict15 *uc)

{
  MemoryRegion_conflict *mr;
  gpointer pvVar1;
  MemoryRegion_conflict *physmr;
  AddressSpace *as;
  uc_struct_conflict15 *uc_local;
  
  if (uc->flat_views != (GHashTable *)0x0) {
    g_hash_table_destroy(uc->flat_views);
    uc->flat_views = (GHashTable *)0x0;
  }
  flatviews_init(uc);
  for (physmr = (MemoryRegion_conflict *)(uc->address_spaces).tqh_first;
      physmr != (MemoryRegion_conflict *)0x0; physmr = physmr->container) {
    mr = memory_region_get_flatview_root(*(MemoryRegion_conflict **)physmr);
    pvVar1 = g_hash_table_lookup(uc->flat_views,mr);
    if (pvVar1 == (gpointer)0x0) {
      generate_memory_topology(uc,mr);
    }
  }
  return;
}

Assistant:

static void flatviews_reset(struct uc_struct *uc)
{
    AddressSpace *as;

    if (uc->flat_views) {
        g_hash_table_destroy(uc->flat_views);
        uc->flat_views = NULL;
    }
    flatviews_init(uc);

    /* Render unique FVs */
    QTAILQ_FOREACH(as, &uc->address_spaces, address_spaces_link) {
        MemoryRegion *physmr = memory_region_get_flatview_root(as->root);

        if (g_hash_table_lookup(uc->flat_views, physmr)) {
            continue;
        }

        generate_memory_topology(uc, physmr);
    }
}